

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx512f.hpp
# Opt level: O3

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::weight_from_cos
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx512bw> *this,
          PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined4 uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  batch *in_RAX;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 in_ZMM0 [64];
  
  uVar1 = *(undefined4 *)&this[0xf].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar12._16_4_ = uVar1;
  auVar12._20_4_ = uVar1;
  auVar12._24_4_ = uVar1;
  auVar12._28_4_ = uVar1;
  auVar12._32_4_ = uVar1;
  auVar12._36_4_ = uVar1;
  auVar12._40_4_ = uVar1;
  auVar12._44_4_ = uVar1;
  auVar12._48_4_ = uVar1;
  auVar12._52_4_ = uVar1;
  auVar12._56_4_ = uVar1;
  auVar12._60_4_ = uVar1;
  uVar7 = vcmpps_avx512f(in_ZMM0,auVar12,0xd);
  if ((short)uVar7 == -1) {
    vbroadcastss_avx512f(ZEXT416(0x3f800000));
    return in_RAX;
  }
  auVar12 = vbroadcastss_avx512f
                      (ZEXT416(*(uint *)((long)&this[0xf].super_PolarExtentCore.
                                                _vptr_PolarExtentCore + 4)));
  uVar7 = vcmpps_avx512f(in_ZMM0,auVar12,2);
  if ((short)uVar7 != -1) {
    auVar13 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
    auVar14 = vandps_avx512dq(in_ZMM0,auVar13);
    auVar15 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
    uVar8 = vcmpps_avx512f(auVar15,auVar14,1);
    auVar16 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
    auVar14 = vfmadd213ps_avx512f(auVar14,auVar16,auVar15);
    auVar14 = vsqrtps_avx512f(auVar14);
    bVar2 = (byte)uVar8;
    auVar17._0_4_ = (uint)(bVar2 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar2 & 1) * in_ZMM0._0_4_;
    bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar4 * auVar14._4_4_ | (uint)!bVar4 * in_ZMM0._4_4_;
    bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar4 * auVar14._8_4_ | (uint)!bVar4 * in_ZMM0._8_4_;
    bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar4 * auVar14._12_4_ | (uint)!bVar4 * in_ZMM0._12_4_;
    bVar4 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar4 * auVar14._16_4_ | (uint)!bVar4 * in_ZMM0._16_4_;
    bVar4 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar4 * auVar14._20_4_ | (uint)!bVar4 * in_ZMM0._20_4_;
    bVar4 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar4 * auVar14._24_4_ | (uint)!bVar4 * in_ZMM0._24_4_;
    bVar4 = (bool)((byte)(uVar8 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar4 * auVar14._28_4_ | (uint)!bVar4 * in_ZMM0._28_4_;
    bVar5 = (byte)(uVar8 >> 8);
    auVar17._32_4_ = (uint)(bVar5 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar5 & 1) * in_ZMM0._32_4_;
    bVar4 = (bool)((byte)(uVar8 >> 9) & 1);
    auVar17._36_4_ = (uint)bVar4 * auVar14._36_4_ | (uint)!bVar4 * in_ZMM0._36_4_;
    bVar4 = (bool)((byte)(uVar8 >> 10) & 1);
    auVar17._40_4_ = (uint)bVar4 * auVar14._40_4_ | (uint)!bVar4 * in_ZMM0._40_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xb) & 1);
    auVar17._44_4_ = (uint)bVar4 * auVar14._44_4_ | (uint)!bVar4 * in_ZMM0._44_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xc) & 1);
    auVar17._48_4_ = (uint)bVar4 * auVar14._48_4_ | (uint)!bVar4 * in_ZMM0._48_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xd) & 1);
    auVar17._52_4_ = (uint)bVar4 * auVar14._52_4_ | (uint)!bVar4 * in_ZMM0._52_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xe) & 1);
    auVar17._56_4_ = (uint)bVar4 * auVar14._56_4_ | (uint)!bVar4 * in_ZMM0._56_4_;
    bVar4 = SUB81(uVar8 >> 0xf,0);
    auVar17._60_4_ = (uint)bVar4 * auVar14._60_4_ | (uint)!bVar4 * in_ZMM0._60_4_;
    auVar13 = vandps_avx512dq(auVar17,auVar13);
    uVar9 = vcmpps_avx512f(auVar15,auVar13,1);
    auVar14 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar14 = vsubps_avx512f(auVar14,auVar13);
    auVar18 = vmulps_avx512f(auVar13,auVar13);
    auVar14 = vmulps_avx512f(auVar14,auVar15);
    bVar3 = (byte)uVar9;
    auVar19._0_4_ = (uint)(bVar3 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar18._0_4_;
    bVar4 = (bool)((byte)(uVar9 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar4 * auVar14._4_4_ | (uint)!bVar4 * auVar18._4_4_;
    bVar4 = (bool)((byte)(uVar9 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar4 * auVar14._8_4_ | (uint)!bVar4 * auVar18._8_4_;
    bVar4 = (bool)((byte)(uVar9 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar4 * auVar14._12_4_ | (uint)!bVar4 * auVar18._12_4_;
    bVar4 = (bool)((byte)(uVar9 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar4 * auVar14._16_4_ | (uint)!bVar4 * auVar18._16_4_;
    bVar4 = (bool)((byte)(uVar9 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar4 * auVar14._20_4_ | (uint)!bVar4 * auVar18._20_4_;
    bVar4 = (bool)((byte)(uVar9 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar4 * auVar14._24_4_ | (uint)!bVar4 * auVar18._24_4_;
    bVar4 = (bool)((byte)(uVar9 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar4 * auVar14._28_4_ | (uint)!bVar4 * auVar18._28_4_;
    bVar6 = (byte)(uVar9 >> 8);
    auVar19._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._32_4_;
    bVar4 = (bool)((byte)(uVar9 >> 9) & 1);
    auVar19._36_4_ = (uint)bVar4 * auVar14._36_4_ | (uint)!bVar4 * auVar18._36_4_;
    bVar4 = (bool)((byte)(uVar9 >> 10) & 1);
    auVar19._40_4_ = (uint)bVar4 * auVar14._40_4_ | (uint)!bVar4 * auVar18._40_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xb) & 1);
    auVar19._44_4_ = (uint)bVar4 * auVar14._44_4_ | (uint)!bVar4 * auVar18._44_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xc) & 1);
    auVar19._48_4_ = (uint)bVar4 * auVar14._48_4_ | (uint)!bVar4 * auVar18._48_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xd) & 1);
    auVar19._52_4_ = (uint)bVar4 * auVar14._52_4_ | (uint)!bVar4 * auVar18._52_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xe) & 1);
    auVar19._56_4_ = (uint)bVar4 * auVar14._56_4_ | (uint)!bVar4 * auVar18._56_4_;
    bVar4 = SUB81(uVar9 >> 0xf,0);
    auVar19._60_4_ = (uint)bVar4 * auVar14._60_4_ | (uint)!bVar4 * auVar18._60_4_;
    auVar14 = vsqrtps_avx512f(auVar19);
    auVar20._0_4_ = (uint)(bVar3 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar13._0_4_;
    bVar4 = (bool)((byte)(uVar9 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar4 * auVar14._4_4_ | (uint)!bVar4 * auVar13._4_4_;
    bVar4 = (bool)((byte)(uVar9 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar4 * auVar14._8_4_ | (uint)!bVar4 * auVar13._8_4_;
    bVar4 = (bool)((byte)(uVar9 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar4 * auVar14._12_4_ | (uint)!bVar4 * auVar13._12_4_;
    bVar4 = (bool)((byte)(uVar9 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar4 * auVar14._16_4_ | (uint)!bVar4 * auVar13._16_4_;
    bVar4 = (bool)((byte)(uVar9 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar4 * auVar14._20_4_ | (uint)!bVar4 * auVar13._20_4_;
    bVar4 = (bool)((byte)(uVar9 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar4 * auVar14._24_4_ | (uint)!bVar4 * auVar13._24_4_;
    bVar4 = (bool)((byte)(uVar9 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar4 * auVar14._28_4_ | (uint)!bVar4 * auVar13._28_4_;
    auVar20._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar13._32_4_;
    bVar4 = (bool)((byte)(uVar9 >> 9) & 1);
    auVar20._36_4_ = (uint)bVar4 * auVar14._36_4_ | (uint)!bVar4 * auVar13._36_4_;
    bVar4 = (bool)((byte)(uVar9 >> 10) & 1);
    auVar20._40_4_ = (uint)bVar4 * auVar14._40_4_ | (uint)!bVar4 * auVar13._40_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xb) & 1);
    auVar20._44_4_ = (uint)bVar4 * auVar14._44_4_ | (uint)!bVar4 * auVar13._44_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xc) & 1);
    auVar20._48_4_ = (uint)bVar4 * auVar14._48_4_ | (uint)!bVar4 * auVar13._48_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xd) & 1);
    auVar20._52_4_ = (uint)bVar4 * auVar14._52_4_ | (uint)!bVar4 * auVar13._52_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xe) & 1);
    auVar20._56_4_ = (uint)bVar4 * auVar14._56_4_ | (uint)!bVar4 * auVar13._56_4_;
    bVar4 = SUB81(uVar9 >> 0xf,0);
    auVar20._60_4_ = (uint)bVar4 * auVar14._60_4_ | (uint)!bVar4 * auVar13._60_4_;
    auVar14 = vbroadcastss_avx512f(ZEXT416(0x3d2cb352));
    auVar13._8_4_ = 0x3cc617e3;
    auVar13._0_8_ = 0x3cc617e33cc617e3;
    auVar13._12_4_ = 0x3cc617e3;
    auVar13._16_4_ = 0x3cc617e3;
    auVar13._20_4_ = 0x3cc617e3;
    auVar13._24_4_ = 0x3cc617e3;
    auVar13._28_4_ = 0x3cc617e3;
    auVar13._32_4_ = 0x3cc617e3;
    auVar13._36_4_ = 0x3cc617e3;
    auVar13._40_4_ = 0x3cc617e3;
    auVar13._44_4_ = 0x3cc617e3;
    auVar13._48_4_ = 0x3cc617e3;
    auVar13._52_4_ = 0x3cc617e3;
    auVar13._56_4_ = 0x3cc617e3;
    auVar13._60_4_ = 0x3cc617e3;
    auVar13 = vfmadd213ps_avx512f(auVar14,auVar19,auVar13);
    auVar14._8_4_ = 0x3d3a3ec7;
    auVar14._0_8_ = 0x3d3a3ec73d3a3ec7;
    auVar14._12_4_ = 0x3d3a3ec7;
    auVar14._16_4_ = 0x3d3a3ec7;
    auVar14._20_4_ = 0x3d3a3ec7;
    auVar14._24_4_ = 0x3d3a3ec7;
    auVar14._28_4_ = 0x3d3a3ec7;
    auVar14._32_4_ = 0x3d3a3ec7;
    auVar14._36_4_ = 0x3d3a3ec7;
    auVar14._40_4_ = 0x3d3a3ec7;
    auVar14._44_4_ = 0x3d3a3ec7;
    auVar14._48_4_ = 0x3d3a3ec7;
    auVar14._52_4_ = 0x3d3a3ec7;
    auVar14._56_4_ = 0x3d3a3ec7;
    auVar14._60_4_ = 0x3d3a3ec7;
    auVar13 = vfmadd213ps_avx512f(auVar13,auVar19,auVar14);
    auVar15._8_4_ = 0x3d9980f6;
    auVar15._0_8_ = 0x3d9980f63d9980f6;
    auVar15._12_4_ = 0x3d9980f6;
    auVar15._16_4_ = 0x3d9980f6;
    auVar15._20_4_ = 0x3d9980f6;
    auVar15._24_4_ = 0x3d9980f6;
    auVar15._28_4_ = 0x3d9980f6;
    auVar15._32_4_ = 0x3d9980f6;
    auVar15._36_4_ = 0x3d9980f6;
    auVar15._40_4_ = 0x3d9980f6;
    auVar15._44_4_ = 0x3d9980f6;
    auVar15._48_4_ = 0x3d9980f6;
    auVar15._52_4_ = 0x3d9980f6;
    auVar15._56_4_ = 0x3d9980f6;
    auVar15._60_4_ = 0x3d9980f6;
    auVar13 = vfmadd213ps_avx512f(auVar13,auVar19,auVar15);
    auVar18._8_4_ = 0x3e2aaae4;
    auVar18._0_8_ = 0x3e2aaae43e2aaae4;
    auVar18._12_4_ = 0x3e2aaae4;
    auVar18._16_4_ = 0x3e2aaae4;
    auVar18._20_4_ = 0x3e2aaae4;
    auVar18._24_4_ = 0x3e2aaae4;
    auVar18._28_4_ = 0x3e2aaae4;
    auVar18._32_4_ = 0x3e2aaae4;
    auVar18._36_4_ = 0x3e2aaae4;
    auVar18._40_4_ = 0x3e2aaae4;
    auVar18._44_4_ = 0x3e2aaae4;
    auVar18._48_4_ = 0x3e2aaae4;
    auVar18._52_4_ = 0x3e2aaae4;
    auVar18._56_4_ = 0x3e2aaae4;
    auVar18._60_4_ = 0x3e2aaae4;
    auVar13 = vfmadd213ps_avx512f(auVar13,auVar19,auVar18);
    auVar14 = vmulps_avx512f(auVar19,auVar20);
    auVar13 = vfmadd213ps_avx512f(auVar14,auVar13,auVar20);
    auVar14 = vaddps_avx512f(auVar13,auVar13);
    auVar15 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
    auVar14 = vsubps_avx512f(auVar15,auVar14);
    auVar21._0_4_ = (uint)(bVar3 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar13._0_4_;
    bVar4 = (bool)((byte)(uVar9 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar4 * auVar14._4_4_ | (uint)!bVar4 * auVar13._4_4_;
    bVar4 = (bool)((byte)(uVar9 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar4 * auVar14._8_4_ | (uint)!bVar4 * auVar13._8_4_;
    bVar4 = (bool)((byte)(uVar9 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar4 * auVar14._12_4_ | (uint)!bVar4 * auVar13._12_4_;
    bVar4 = (bool)((byte)(uVar9 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar4 * auVar14._16_4_ | (uint)!bVar4 * auVar13._16_4_;
    bVar4 = (bool)((byte)(uVar9 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar4 * auVar14._20_4_ | (uint)!bVar4 * auVar13._20_4_;
    bVar4 = (bool)((byte)(uVar9 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar4 * auVar14._24_4_ | (uint)!bVar4 * auVar13._24_4_;
    bVar4 = (bool)((byte)(uVar9 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar4 * auVar14._28_4_ | (uint)!bVar4 * auVar13._28_4_;
    auVar21._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar13._32_4_;
    bVar4 = (bool)((byte)(uVar9 >> 9) & 1);
    auVar21._36_4_ = (uint)bVar4 * auVar14._36_4_ | (uint)!bVar4 * auVar13._36_4_;
    bVar4 = (bool)((byte)(uVar9 >> 10) & 1);
    auVar21._40_4_ = (uint)bVar4 * auVar14._40_4_ | (uint)!bVar4 * auVar13._40_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xb) & 1);
    auVar21._44_4_ = (uint)bVar4 * auVar14._44_4_ | (uint)!bVar4 * auVar13._44_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xc) & 1);
    auVar21._48_4_ = (uint)bVar4 * auVar14._48_4_ | (uint)!bVar4 * auVar13._48_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xd) & 1);
    auVar21._52_4_ = (uint)bVar4 * auVar14._52_4_ | (uint)!bVar4 * auVar13._52_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xe) & 1);
    auVar21._56_4_ = (uint)bVar4 * auVar14._56_4_ | (uint)!bVar4 * auVar13._56_4_;
    bVar4 = SUB81(uVar9 >> 0xf,0);
    auVar21._60_4_ = (uint)bVar4 * auVar14._60_4_ | (uint)!bVar4 * auVar13._60_4_;
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar10._16_4_ = 0x80000000;
    auVar10._20_4_ = 0x80000000;
    auVar10._24_4_ = 0x80000000;
    auVar10._28_4_ = 0x80000000;
    auVar10._32_4_ = 0x80000000;
    auVar10._36_4_ = 0x80000000;
    auVar10._40_4_ = 0x80000000;
    auVar10._44_4_ = 0x80000000;
    auVar10._48_4_ = 0x80000000;
    auVar10._52_4_ = 0x80000000;
    auVar10._56_4_ = 0x80000000;
    auVar10._60_4_ = 0x80000000;
    auVar13 = vpternlogq_avx512f(auVar21,auVar17,auVar10,0x78);
    auVar14 = vaddps_avx512f(auVar13,auVar13);
    auVar22._0_4_ = (uint)(bVar2 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar13._0_4_;
    bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar4 * auVar14._4_4_ | (uint)!bVar4 * auVar13._4_4_;
    bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar4 * auVar14._8_4_ | (uint)!bVar4 * auVar13._8_4_;
    bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar4 * auVar14._12_4_ | (uint)!bVar4 * auVar13._12_4_;
    bVar4 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar4 * auVar14._16_4_ | (uint)!bVar4 * auVar13._16_4_;
    bVar4 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar4 * auVar14._20_4_ | (uint)!bVar4 * auVar13._20_4_;
    bVar4 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar4 * auVar14._24_4_ | (uint)!bVar4 * auVar13._24_4_;
    bVar4 = (bool)((byte)(uVar8 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar4 * auVar14._28_4_ | (uint)!bVar4 * auVar13._28_4_;
    auVar22._32_4_ = (uint)(bVar5 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar13._32_4_;
    bVar4 = (bool)((byte)(uVar8 >> 9) & 1);
    auVar22._36_4_ = (uint)bVar4 * auVar14._36_4_ | (uint)!bVar4 * auVar13._36_4_;
    bVar4 = (bool)((byte)(uVar8 >> 10) & 1);
    auVar22._40_4_ = (uint)bVar4 * auVar14._40_4_ | (uint)!bVar4 * auVar13._40_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xb) & 1);
    auVar22._44_4_ = (uint)bVar4 * auVar14._44_4_ | (uint)!bVar4 * auVar13._44_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xc) & 1);
    auVar22._48_4_ = (uint)bVar4 * auVar14._48_4_ | (uint)!bVar4 * auVar13._48_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xd) & 1);
    auVar22._52_4_ = (uint)bVar4 * auVar14._52_4_ | (uint)!bVar4 * auVar13._52_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xe) & 1);
    auVar22._56_4_ = (uint)bVar4 * auVar14._56_4_ | (uint)!bVar4 * auVar13._56_4_;
    bVar4 = SUB81(uVar8 >> 0xf,0);
    auVar22._60_4_ = (uint)bVar4 * auVar14._60_4_ | (uint)!bVar4 * auVar13._60_4_;
    uVar9 = vcmpps_avx512f(in_ZMM0,auVar16,1);
    auVar13 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
    auVar13 = vsubps_avx512f(auVar13,auVar22);
    bVar4 = (bool)((byte)uVar9 & 1);
    auVar23._0_4_ = (uint)bVar4 * auVar13._0_4_ | !bVar4 * auVar22._0_4_;
    bVar4 = (bool)((byte)(uVar9 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar4 * auVar13._4_4_ | !bVar4 * auVar22._4_4_;
    bVar4 = (bool)((byte)(uVar9 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar4 * auVar13._8_4_ | !bVar4 * auVar22._8_4_;
    bVar4 = (bool)((byte)(uVar9 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar4 * auVar13._12_4_ | !bVar4 * auVar22._12_4_;
    bVar4 = (bool)((byte)(uVar9 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar4 * auVar13._16_4_ | !bVar4 * auVar22._16_4_;
    bVar4 = (bool)((byte)(uVar9 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar4 * auVar13._20_4_ | !bVar4 * auVar22._20_4_;
    bVar4 = (bool)((byte)(uVar9 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar4 * auVar13._24_4_ | !bVar4 * auVar22._24_4_;
    bVar4 = (bool)((byte)(uVar9 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar4 * auVar13._28_4_ | !bVar4 * auVar22._28_4_;
    bVar4 = (bool)((byte)(uVar9 >> 8) & 1);
    auVar23._32_4_ = (uint)bVar4 * auVar13._32_4_ | !bVar4 * auVar22._32_4_;
    bVar4 = (bool)((byte)(uVar9 >> 9) & 1);
    auVar23._36_4_ = (uint)bVar4 * auVar13._36_4_ | !bVar4 * auVar22._36_4_;
    bVar4 = (bool)((byte)(uVar9 >> 10) & 1);
    auVar23._40_4_ = (uint)bVar4 * auVar13._40_4_ | !bVar4 * auVar22._40_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xb) & 1);
    auVar23._44_4_ = (uint)bVar4 * auVar13._44_4_ | !bVar4 * auVar22._44_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xc) & 1);
    auVar23._48_4_ = (uint)bVar4 * auVar13._48_4_ | !bVar4 * auVar22._48_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xd) & 1);
    auVar23._52_4_ = (uint)bVar4 * auVar13._52_4_ | !bVar4 * auVar22._52_4_;
    bVar4 = (bool)((byte)(uVar9 >> 0xe) & 1);
    auVar23._56_4_ = (uint)bVar4 * auVar13._56_4_ | !bVar4 * auVar22._56_4_;
    bVar4 = SUB81(uVar9 >> 0xf,0);
    auVar23._60_4_ = (uint)bVar4 * auVar13._60_4_ | !bVar4 * auVar22._60_4_;
    auVar13 = vsubps_avx512f(auVar15,auVar23);
    auVar24._0_4_ = (bVar2 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar13._0_4_;
    bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar24._4_4_ = bVar4 * auVar23._4_4_ | (uint)!bVar4 * auVar13._4_4_;
    bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar24._8_4_ = bVar4 * auVar23._8_4_ | (uint)!bVar4 * auVar13._8_4_;
    bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar24._12_4_ = bVar4 * auVar23._12_4_ | (uint)!bVar4 * auVar13._12_4_;
    bVar4 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar24._16_4_ = bVar4 * auVar23._16_4_ | (uint)!bVar4 * auVar13._16_4_;
    bVar4 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar24._20_4_ = bVar4 * auVar23._20_4_ | (uint)!bVar4 * auVar13._20_4_;
    bVar4 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar24._24_4_ = bVar4 * auVar23._24_4_ | (uint)!bVar4 * auVar13._24_4_;
    bVar4 = (bool)((byte)(uVar8 >> 7) & 1);
    auVar24._28_4_ = bVar4 * auVar23._28_4_ | (uint)!bVar4 * auVar13._28_4_;
    auVar24._32_4_ = (bVar5 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar13._32_4_;
    bVar4 = (bool)((byte)(uVar8 >> 9) & 1);
    auVar24._36_4_ = bVar4 * auVar23._36_4_ | (uint)!bVar4 * auVar13._36_4_;
    bVar4 = (bool)((byte)(uVar8 >> 10) & 1);
    auVar24._40_4_ = bVar4 * auVar23._40_4_ | (uint)!bVar4 * auVar13._40_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xb) & 1);
    auVar24._44_4_ = bVar4 * auVar23._44_4_ | (uint)!bVar4 * auVar13._44_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xc) & 1);
    auVar24._48_4_ = bVar4 * auVar23._48_4_ | (uint)!bVar4 * auVar13._48_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xd) & 1);
    auVar24._52_4_ = bVar4 * auVar23._52_4_ | (uint)!bVar4 * auVar13._52_4_;
    bVar4 = (bool)((byte)(uVar8 >> 0xe) & 1);
    auVar24._56_4_ = bVar4 * auVar23._56_4_ | (uint)!bVar4 * auVar13._56_4_;
    bVar4 = SUB81(uVar8 >> 0xf,0);
    auVar24._60_4_ = bVar4 * auVar23._60_4_ | (uint)!bVar4 * auVar13._60_4_;
    uVar1 = *(undefined4 *)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore;
    auVar16._4_4_ = uVar1;
    auVar16._0_4_ = uVar1;
    auVar16._8_4_ = uVar1;
    auVar16._12_4_ = uVar1;
    auVar16._16_4_ = uVar1;
    auVar16._20_4_ = uVar1;
    auVar16._24_4_ = uVar1;
    auVar16._28_4_ = uVar1;
    auVar16._32_4_ = uVar1;
    auVar16._36_4_ = uVar1;
    auVar16._40_4_ = uVar1;
    auVar16._44_4_ = uVar1;
    auVar16._48_4_ = uVar1;
    auVar16._52_4_ = uVar1;
    auVar16._56_4_ = uVar1;
    auVar16._60_4_ = uVar1;
    auVar13 = vmulps_avx512f(auVar24,auVar16);
    vcmpps_avx512f(in_ZMM0,auVar12,6);
    uVar1 = *(undefined4 *)((long)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore + 4);
    auVar11._4_4_ = uVar1;
    auVar11._0_4_ = uVar1;
    auVar11._8_4_ = uVar1;
    auVar11._12_4_ = uVar1;
    auVar11._16_4_ = uVar1;
    auVar11._20_4_ = uVar1;
    auVar11._24_4_ = uVar1;
    auVar11._28_4_ = uVar1;
    auVar11._32_4_ = uVar1;
    auVar11._36_4_ = uVar1;
    auVar11._40_4_ = uVar1;
    auVar11._44_4_ = uVar1;
    auVar11._48_4_ = uVar1;
    auVar11._52_4_ = uVar1;
    auVar11._56_4_ = uVar1;
    auVar11._60_4_ = uVar1;
    vaddps_avx512f(auVar13,auVar11);
    return in_RAX;
  }
  return in_RAX;
}

Assistant:

inline batch_bool<float, A> ge(batch<float, A> const& self, batch<float, A> const& other, requires_arch<avx512f>) noexcept
        {
            return _mm512_cmp_ps_mask(self, other, _CMP_GE_OQ);
        }